

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O0

void __thiscall fp::Algorithm::SetDefaults(Algorithm *this)

{
  int iVar1;
  reference pvVar2;
  Algorithm *this_local;
  
  this->temp_goal_ = false;
  API::clearAllColor();
  API::setColor(0,0,'g');
  pvVar2 = std::array<int,_2UL>::operator[](&this->goal1_,1);
  iVar1 = *pvVar2;
  pvVar2 = std::array<int,_2UL>::operator[](&this->goal1_,0);
  API::setColor(iVar1,0xf - *pvVar2,'w');
  pvVar2 = std::array<int,_2UL>::operator[](&this->goal2_,1);
  iVar1 = *pvVar2;
  pvVar2 = std::array<int,_2UL>::operator[](&this->goal2_,0);
  API::setColor(iVar1,0xf - *pvVar2,'w');
  pvVar2 = std::array<int,_2UL>::operator[](&this->goal3_,1);
  iVar1 = *pvVar2;
  pvVar2 = std::array<int,_2UL>::operator[](&this->goal3_,0);
  API::setColor(iVar1,0xf - *pvVar2,'w');
  pvVar2 = std::array<int,_2UL>::operator[](&this->goal4_,1);
  iVar1 = *pvVar2;
  pvVar2 = std::array<int,_2UL>::operator[](&this->goal4_,0);
  API::setColor(iVar1,0xf - *pvVar2,'w');
  return;
}

Assistant:

void fp::Algorithm::SetDefaults() {
    this->temp_goal_ = false;
    fp::API::clearAllColor();
    fp::API::setColor(0, 0, 'g');
    fp::API::setColor(this->goal1_[1], 15 - this->goal1_[0], 'w');
    fp::API::setColor(this->goal2_[1], 15 - this->goal2_[0], 'w');
    fp::API::setColor(this->goal3_[1], 15 - this->goal3_[0], 'w');
    fp::API::setColor(this->goal4_[1], 15 - this->goal4_[0], 'w');
}